

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall QDir::cd(QDir *this,QString *dirName)

{
  QLatin1StringView s;
  QChar ch;
  bool bVar1;
  bool bVar2;
  qsizetype qVar3;
  QDirPrivate *copy;
  QDirPrivate *in_RSI;
  long in_FS_OFFSET;
  QDirPrivate *d;
  unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> dir;
  QString newPath;
  undefined4 in_stack_fffffffffffffed8;
  CaseSensitivity in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  CaseSensitivity in_stack_fffffffffffffee4;
  QFileSystemEntry *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  byte in_stack_fffffffffffffef7;
  QDirPrivate *in_stack_fffffffffffffef8;
  QDirPrivate *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  QDirPrivate *in_stack_ffffffffffffff10;
  bool local_d9;
  bool local_a1;
  QChar local_72 [13];
  QLatin1StringView local_58;
  QChar local_46;
  QChar local_44;
  QChar local_42 [13];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedDataPointer<QDirPrivate>::constData((QSharedDataPointer<QDirPrivate> *)0x1908b5);
  bVar1 = QString::isEmpty((QString *)0x1908c4);
  local_d9 = true;
  if (!bVar1) {
    in_stack_ffffffffffffff10 = in_RSI;
    QChar::QChar<char16_t,_true>(&local_a,L'.');
    local_d9 = ::operator==((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0)
                            ,(QChar *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
    ;
  }
  if (local_d9 != false) {
    local_a1 = true;
    goto LAB_00190cc6;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x190954);
  bVar1 = isAbsolutePath((QString *)0x19095e);
  if (bVar1) {
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    qt_cleanPath((QString *)in_stack_fffffffffffffef8);
LAB_00190bf3:
    copy = (QDirPrivate *)operator_new(0x118);
    QSharedDataPointer<QDirPrivate>::constData((QSharedDataPointer<QDirPrivate> *)0x190c1b);
    QDirPrivate::QDirPrivate
              ((QDirPrivate *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),copy);
    std::unique_ptr<QDirPrivate,std::default_delete<QDirPrivate>>::
    unique_ptr<std::default_delete<QDirPrivate>,void>
              ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (pointer)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::operator->
              ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)0x190c47);
    QDirPrivate::setPath
              ((QDirPrivate *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
               (QString *)in_stack_ffffffffffffff00);
    std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::operator->
              ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)0x190c64);
    local_a1 = QDirPrivate::exists(in_stack_ffffffffffffff10);
    if (local_a1) {
      std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::release
                ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)0x190c8f);
      QSharedDataPointer<QDirPrivate>::operator=
                ((QSharedDataPointer<QDirPrivate> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (QDirPrivate *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    }
    std::unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_>::~unique_ptr
              ((unique_ptr<QDirPrivate,_std::default_delete<QDirPrivate>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  }
  else {
    QFileSystemEntry::filePath(in_stack_fffffffffffffee8);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    QString::~QString((QString *)0x1909c0);
    QChar::QChar<char16_t,_true>(local_42,L'/');
    bVar1 = QString::endsWith(&in_stack_fffffffffffffee8->m_filePath,
                              (QChar)(char16_t)((ulong)in_stack_fffffffffffffef8 >> 0x30),
                              in_stack_fffffffffffffee4);
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(&local_44,L'/');
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          (QChar)(char16_t)((ulong)in_stack_fffffffffffffee8 >> 0x30));
    }
    QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    in_stack_ffffffffffffff00 = in_RSI;
    QChar::QChar<char16_t,_true>(&local_46,L'/');
    ch.ucs._1_1_ = in_stack_ffffffffffffff0f;
    ch.ucs._0_1_ = in_stack_ffffffffffffff0e;
    qVar3 = QString::indexOf(&in_stack_fffffffffffffee8->m_filePath,ch,
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                             in_stack_fffffffffffffedc);
    bVar1 = false;
    in_stack_fffffffffffffef7 = true;
    if (qVar3 < 0) {
      local_58 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffee8,
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      bVar2 = ::operator==(&in_stack_fffffffffffffee8->m_filePath,
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      in_stack_fffffffffffffef7 = true;
      in_stack_fffffffffffffef8 = in_RSI;
      if (!bVar2) {
        QFileSystemEntry::filePath(in_stack_fffffffffffffee8);
        bVar1 = true;
        QChar::QChar<char16_t,_true>(local_72,L'.');
        in_stack_fffffffffffffef7 =
             ::operator==((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          (QChar *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        in_stack_fffffffffffffef8 = in_RSI;
      }
    }
    in_stack_ffffffffffffff0f = in_stack_fffffffffffffef7;
    if (bVar1) {
      QString::~QString((QString *)0x190b26);
    }
    if ((in_stack_fffffffffffffef7 & 1) == 0) goto LAB_00190bf3;
    bVar1 = qt_cleanPath((QString *)in_stack_fffffffffffffef8);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffee8,
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      s.m_size._0_6_ = in_stack_ffffffffffffff08;
      s.m_data = (char *)in_stack_ffffffffffffff00;
      s.m_size._6_1_ = in_stack_ffffffffffffff0e;
      s.m_size._7_1_ = in_stack_ffffffffffffff0f;
      bVar1 = QString::startsWith((QString *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),s,
                                  CaseInsensitive);
      if (bVar1) {
        QFileInfo::QFileInfo
                  ((QFileInfo *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   &in_stack_fffffffffffffee8->m_filePath);
        QFileInfo::absoluteFilePath((QFileInfo *)in_stack_fffffffffffffef8);
        QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           (QString *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8))
        ;
        QString::~QString((QString *)0x190be2);
        QFileInfo::~QFileInfo((QFileInfo *)0x190bef);
      }
      goto LAB_00190bf3;
    }
    local_a1 = false;
  }
  QString::~QString((QString *)0x190cc6);
LAB_00190cc6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a1;
}

Assistant:

bool QDir::cd(const QString &dirName)
{
    // Don't detach just yet.
    const QDirPrivate * const d = d_ptr.constData();

    if (dirName.isEmpty() || dirName == u'.')
        return true;
    QString newPath;
    if (isAbsolutePath(dirName)) {
        newPath = dirName;
        qt_cleanPath(&newPath);
    } else {
        newPath = d->dirEntry.filePath();
        if (!newPath.endsWith(u'/'))
            newPath += u'/';
        newPath += dirName;
        if (dirName.indexOf(u'/') >= 0
            || dirName == ".."_L1
            || d->dirEntry.filePath() == u'.') {
            if (!qt_cleanPath(&newPath))
                return false;
            /*
              If newPath starts with .., we convert it to absolute to
              avoid infinite looping on

                  QDir dir(".");
                  while (dir.cdUp())
                      ;
            */
            if (newPath.startsWith(".."_L1)) {
                newPath = QFileInfo(newPath).absoluteFilePath();
            }
        }
    }

    std::unique_ptr<QDirPrivate> dir(new QDirPrivate(*d_ptr.constData()));
    dir->setPath(newPath);
    if (!dir->exists())
        return false;

    d_ptr = dir.release();
    return true;
}